

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleep.c
# Opt level: O0

void nn_sleep(int milliseconds)

{
  FILE *__stream;
  int *piVar1;
  char *pcVar2;
  uint *puVar3;
  undefined1 local_20 [8];
  timespec ts;
  int rc;
  int milliseconds_local;
  
  local_20 = (undefined1  [8])(long)(milliseconds / 1000);
  ts.tv_sec = (__time_t)((milliseconds % 1000) * 1000000);
  ts.tv_nsec._4_4_ = milliseconds;
  ts.tv_nsec._0_4_ = nanosleep((timespec *)local_20,(timespec *)0x0);
  if ((int)ts.tv_nsec != 0) {
    nn_backtrace_print();
    __stream = _stderr;
    piVar1 = __errno_location();
    pcVar2 = nn_err_strerror(*piVar1);
    puVar3 = (uint *)__errno_location();
    fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar2,(ulong)*puVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nanomsg/tests/../src/utils/sleep.c"
            ,0x2f);
    fflush(_stderr);
    nn_err_abort();
  }
  return;
}

Assistant:

void nn_sleep (int milliseconds)
{
    int rc;
    struct timespec ts;

    ts.tv_sec = milliseconds / 1000;
    ts.tv_nsec = milliseconds % 1000 * 1000000;
    rc = nanosleep (&ts, NULL);
    errno_assert (rc == 0);    
}